

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkTypeAsFullyUsed
          (EliminateDeadMembersPass *this,uint32_t type_id)

{
  uint32_t uVar1;
  DefUseManager *this_00;
  Instruction *this_01;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *this_02;
  uint uVar2;
  undefined8 local_38;
  
  while( true ) {
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    this_01 = analysis::DefUseManager::GetDef(this_00,type_id);
    if (this_01 == (Instruction *)0x0) {
      __assert_fail("type_inst != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                    ,0x93,
                    "void spvtools::opt::EliminateDeadMembersPass::MarkTypeAsFullyUsed(uint32_t)");
    }
    if (1 < this_01->opcode_ - OpTypeArray) break;
    type_id = Instruction::GetSingleWordInOperand(this_01,0);
  }
  if (this_01->opcode_ == OpTypeStruct) {
    local_38 = (ulong)type_id << 0x20;
    uVar2 = 0;
    while( true ) {
      local_38 = CONCAT44(local_38._4_4_,uVar2);
      uVar1 = Instruction::NumInOperands(this_01);
      if (uVar1 <= uVar2) break;
      this_02 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                 *)std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->used_members_,(key_type *)((long)&local_38 + 4));
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>(this_02,(uint *)&local_38);
      uVar1 = Instruction::GetSingleWordInOperand(this_01,(uint32_t)local_38);
      MarkTypeAsFullyUsed(this,uVar1);
      uVar2 = (uint32_t)local_38 + 1;
    }
  }
  return;
}

Assistant:

void EliminateDeadMembersPass::MarkTypeAsFullyUsed(uint32_t type_id) {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
  assert(type_inst != nullptr);

  switch (type_inst->opcode()) {
    case spv::Op::OpTypeStruct:
      // Mark every member and its type as fully used.
      for (uint32_t i = 0; i < type_inst->NumInOperands(); ++i) {
        used_members_[type_id].insert(i);
        MarkTypeAsFullyUsed(type_inst->GetSingleWordInOperand(i));
      }
      break;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      MarkTypeAsFullyUsed(
          type_inst->GetSingleWordInOperand(kArrayElementTypeIdx));
      break;
    default:
      break;
  }
}